

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APInt::sextOrTrunc(APInt *this,uint width)

{
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined4 in_register_00000034;
  APInt *that;
  double in_XMM0_Qa;
  APInt AVar2;
  uint width_local;
  APInt *this_local;
  undefined8 uVar1;
  
  that = (APInt *)CONCAT44(in_register_00000034,width);
  if (that->BitWidth < in_EDX) {
    AVar2 = sext(this,width);
    uVar1 = AVar2._8_8_;
  }
  else if (in_EDX < that->BitWidth) {
    trunc(this,in_XMM0_Qa);
    uVar1 = extraout_RDX;
  }
  else {
    APInt(this,that);
    uVar1 = extraout_RDX_00;
  }
  AVar2._8_8_ = uVar1;
  AVar2.U.pVal = (uint64_t *)this;
  return AVar2;
}

Assistant:

APInt APInt::sextOrTrunc(unsigned width) const {
  if (BitWidth < width)
    return sext(width);
  if (BitWidth > width)
    return trunc(width);
  return *this;
}